

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O3

Persistence_landscape * __thiscall
Gudhi::Persistence_representations::operation_on_pair_of_landscapes<std::minus<double>>
          (Persistence_landscape *__return_storage_ptr__,Persistence_representations *this,
          Persistence_landscape *land1,Persistence_landscape *land2)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer *pppVar3;
  double dVar4;
  pointer ppVar5;
  pointer ppVar6;
  pointer ppVar7;
  undefined8 uVar8;
  Persistence_landscape *pPVar9;
  Persistence_representations *pPVar10;
  ulong uVar11;
  pointer pvVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  pointer pvVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  size_t i;
  ulong uVar23;
  double dVar24;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> lambda_n;
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  land;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_98;
  pair<double,_double> local_78;
  Persistence_landscape *local_60;
  Persistence_representations *local_58;
  ulong local_50;
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  local_48;
  
  (__return_storage_ptr__->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->number_of_functions_for_vectorization = 0;
  (__return_storage_ptr__->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->number_of_functions_for_projections_to_reals = 0;
  uVar11 = (*(long *)(this + 8) - *(long *)this >> 3) * -0x5555555555555555;
  lVar14 = (long)(land1->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(land1->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar15 = lVar14 * -0x5555555555555555;
  if (uVar15 <= uVar11 && uVar11 + lVar14 * 0x5555555555555555 != 0) {
    uVar15 = uVar11;
  }
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::vector(&local_48,uVar15,(allocator_type *)&local_98);
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::operator=(&__return_storage_ptr__->land,&local_48);
  uVar15 = 0;
  local_60 = __return_storage_ptr__;
  local_58 = this;
  do {
    lVar14 = *(long *)this;
    lVar19 = *(long *)(this + 8);
    uVar23 = lVar19 - lVar14;
    uVar22 = ((long)uVar23 >> 3) * -0x5555555555555555;
    pvVar12 = (land1->land).
              super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar18 = (land1->land).
              super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar20 = (long)pvVar18 - (long)pvVar12;
    uVar13 = ((long)uVar20 >> 3) * -0x5555555555555555;
    uVar11 = uVar22;
    if (uVar13 < uVar22) {
      uVar11 = uVar13;
    }
    if (uVar15 == uVar11) {
      if (uVar13 < uVar22) {
        uVar23 = lVar19 - lVar14;
        uVar11 = ((long)uVar23 >> 3) * -0x5555555555555555;
        uVar20 = (long)pvVar18 - (long)pvVar12;
        uVar15 = ((long)uVar20 >> 3) * -0x5555555555555555;
        if (uVar15 <= uVar11 && uVar11 + ((long)uVar20 >> 3) * 0x5555555555555555 != 0) {
          uVar15 = uVar11;
        }
        if (uVar13 - uVar15 != 0) {
          do {
            std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            vector(&local_98,
                   (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *
                   )(lVar14 + uVar13 * 0x18));
            pPVar10 = local_58;
            lVar14 = *(long *)local_58;
            lVar19 = *(long *)(lVar14 + uVar13 * 0x18);
            lVar17 = *(long *)(lVar14 + 8 + uVar13 * 0x18) - lVar19;
            if (lVar17 != 0) {
              lVar17 = lVar17 >> 4;
              lVar21 = 0;
              do {
                puVar1 = (undefined8 *)(lVar19 + lVar21);
                uVar8 = puVar1[1];
                puVar2 = (undefined8 *)
                         ((long)&(local_98.
                                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->first + lVar21);
                *puVar2 = *puVar1;
                puVar2[1] = uVar8;
                lVar21 = lVar21 + 0x10;
                lVar17 = lVar17 + -1;
              } while (lVar17 != 0);
            }
            pvVar18 = (local_60->land).
                      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar5 = *(pointer *)
                      &pvVar18[uVar13].
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl;
            ppVar6 = *(pointer *)
                      ((long)&pvVar18[uVar13].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl + 8);
            ppVar7 = *(pointer *)
                      ((long)&pvVar18[uVar13].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl + 0x10);
            *(pointer *)
             &pvVar18[uVar13].
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl = local_98.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            pppVar3 = (pointer *)
                      ((long)&pvVar18[uVar13].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl + 8);
            *pppVar3 = local_98.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            pppVar3[1] = local_98.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_98.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start = ppVar5;
            local_98.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = ppVar6;
            local_98.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar7;
            if (ppVar5 != (pointer)0x0) {
              operator_delete(ppVar5,(long)ppVar7 - (long)ppVar5);
              lVar14 = *(long *)pPVar10;
            }
            uVar13 = uVar13 + 1;
            lVar19 = *(long *)(pPVar10 + 8);
            pvVar12 = (land1->land).
                      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pvVar18 = (land1->land).
                      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            uVar23 = lVar19 - lVar14;
            uVar11 = ((long)uVar23 >> 3) * -0x5555555555555555;
            uVar20 = (long)pvVar18 - (long)pvVar12;
            uVar15 = ((long)uVar20 >> 3) * -0x5555555555555555;
            if (uVar15 <= uVar11 && uVar11 + ((long)uVar20 >> 3) * 0x5555555555555555 != 0) {
              uVar15 = uVar11;
            }
          } while (uVar13 != uVar15);
        }
      }
      pPVar9 = local_60;
      if (uVar23 < uVar20) {
        uVar13 = ((long)uVar23 >> 3) * -0x5555555555555555;
        uVar11 = (lVar19 - lVar14 >> 3) * -0x5555555555555555;
        lVar14 = (long)pvVar18 - (long)pvVar12 >> 3;
        uVar15 = lVar14 * -0x5555555555555555;
        if (uVar15 <= uVar11 && uVar11 + lVar14 * 0x5555555555555555 != 0) {
          uVar15 = uVar11;
        }
        if (uVar13 - uVar15 != 0) {
          do {
            std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            vector(&local_98,pvVar12 + uVar13);
            pvVar12 = (land1->land).
                      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar14 = *(long *)&pvVar12[uVar13].
                               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               ._M_impl;
            lVar19 = (long)*(pointer *)
                            ((long)&pvVar12[uVar13].
                                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                    ._M_impl + 8) - lVar14;
            if (lVar19 != 0) {
              lVar19 = lVar19 >> 4;
              lVar17 = 8;
              do {
                dVar4 = *(double *)(lVar14 + lVar17);
                *(undefined8 *)
                 ((long)local_98.
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar17 + -8) =
                     *(undefined8 *)(lVar14 + -8 + lVar17);
                *(double *)
                 ((long)&(local_98.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->first + lVar17) = 0.0 - dVar4;
                lVar17 = lVar17 + 0x10;
                lVar19 = lVar19 + -1;
              } while (lVar19 != 0);
            }
            pvVar18 = (pPVar9->land).
                      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar5 = *(pointer *)
                      &pvVar18[uVar13].
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl;
            ppVar6 = *(pointer *)
                      ((long)&pvVar18[uVar13].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl + 8);
            ppVar7 = *(pointer *)
                      ((long)&pvVar18[uVar13].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl + 0x10);
            *(pointer *)
             &pvVar18[uVar13].
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl = local_98.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            pppVar3 = (pointer *)
                      ((long)&pvVar18[uVar13].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl + 8);
            *pppVar3 = local_98.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            pppVar3[1] = local_98.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_98.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start = ppVar5;
            local_98.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = ppVar6;
            local_98.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar7;
            if (ppVar5 != (pointer)0x0) {
              operator_delete(ppVar5,(long)ppVar7 - (long)ppVar5);
              pvVar12 = (land1->land).
                        super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            uVar13 = uVar13 + 1;
            uVar11 = (*(long *)(local_58 + 8) - *(long *)local_58 >> 3) * -0x5555555555555555;
            lVar14 = (long)(land1->land).
                           super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar12 >> 3;
            uVar15 = lVar14 * -0x5555555555555555;
            if (uVar15 <= uVar11 && uVar11 + lVar14 * 0x5555555555555555 != 0) {
              uVar15 = uVar11;
            }
          } while (uVar13 != uVar15);
        }
      }
      std::
      vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
      ::~vector(&local_48);
      return pPVar9;
    }
    local_98.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pair<double,_double> *)0x0;
    local_98.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar19 = *(long *)(lVar14 + uVar15 * 0x18);
    lVar17 = *(long *)(lVar14 + 8 + uVar15 * 0x18);
    uVar11 = lVar17 - lVar19;
    local_50 = uVar15;
    if (uVar11 < 0x11) {
      uVar13 = 0;
      uVar20 = 0;
    }
    else {
      pvVar18 = (land1->land).
                super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar17 = *(long *)&pvVar18[uVar15].
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl;
      if ((ulong)((long)*(pointer *)
                         ((long)&pvVar18[uVar15].
                                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                 ._M_impl + 8) - lVar17) < 0x11) {
        uVar13 = 0;
        uVar20 = 0;
      }
      else {
        uVar22 = 1;
        uVar13 = 0;
        uVar11 = 1;
        uVar23 = 0;
        do {
          while( true ) {
            uVar20 = uVar11;
            lVar16 = uVar23 * 0x10;
            lVar14 = lVar19 + lVar16;
            dVar4 = *(double *)(lVar19 + lVar16);
            lVar21 = lVar17 + uVar13 * 0x10;
            local_78.first = *(double *)(lVar17 + uVar13 * 0x10);
            if (local_78.first <= dVar4) break;
            dVar24 = (*(double *)(lVar21 + 8) - *(double *)(lVar21 + -8)) /
                     (local_78.first - *(double *)(lVar21 + -0x10));
            local_78.second =
                 *(double *)(lVar14 + 8) -
                 (dVar24 * dVar4 + (*(double *)(lVar21 + -8) - *(double *)(lVar21 + -0x10) * dVar24)
                 );
            if (local_98.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_98.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_78.first = dVar4;
              std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
              _M_realloc_insert<std::pair<double,double>>
                        ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                          *)&local_98,
                         (iterator)
                         local_98.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_78);
            }
            else {
              (local_98.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->first = dVar4;
              (local_98.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->second = local_78.second;
              local_98.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_98.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            lVar14 = *(long *)local_58;
            lVar19 = *(long *)(lVar14 + uVar15 * 0x18);
            lVar17 = *(long *)(lVar14 + 8 + uVar15 * 0x18);
            uVar11 = lVar17 - lVar19;
            if ((ulong)((long)uVar11 >> 4) <= uVar20 + 1) goto LAB_00106ce2;
            pvVar18 = (land1->land).
                      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar17 = *(long *)&pvVar18[uVar15].
                               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               ._M_impl;
            uVar11 = uVar20 + 1;
            uVar23 = uVar20;
            if ((ulong)((long)*(pointer *)
                               ((long)&pvVar18[uVar15].
                                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                       ._M_impl + 8) - lVar17 >> 4) <= uVar22) goto LAB_00106cd3;
          }
          if (dVar4 <= local_78.first) {
            if ((dVar4 == local_78.first) && (!NAN(dVar4) && !NAN(local_78.first))) {
              local_78.second = *(double *)(lVar19 + 8 + lVar16) - *(double *)(lVar21 + 8);
              if (local_98.
                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_98.
                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
                _M_realloc_insert<std::pair<double,double>>
                          ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                            *)&local_98,
                           (iterator)
                           local_98.
                           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_78);
                uVar13 = uVar22;
                uVar23 = uVar20;
              }
              else {
                (local_98.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->first = local_78.first;
                (local_98.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->second = local_78.second;
                local_98.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_98.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
                uVar13 = uVar22;
                uVar23 = uVar20;
              }
            }
          }
          else {
            dVar24 = (*(double *)(lVar14 + -8) - *(double *)(lVar14 + 8)) /
                     (*(double *)(lVar14 + -0x10) - dVar4);
            local_78.second =
                 (dVar24 * local_78.first + (*(double *)(lVar14 + 8) - dVar4 * dVar24)) -
                 *(double *)(lVar21 + 8);
            if (local_98.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_98.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
              _M_realloc_insert<std::pair<double,double>>
                        ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                          *)&local_98,
                         (iterator)
                         local_98.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_78);
              uVar13 = uVar22;
            }
            else {
              (local_98.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->first = local_78.first;
              (local_98.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->second = local_78.second;
              local_98.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_98.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
              uVar13 = uVar22;
            }
          }
          uVar20 = uVar23;
          lVar14 = *(long *)local_58;
          lVar19 = *(long *)(lVar14 + uVar15 * 0x18);
          lVar17 = *(long *)(lVar14 + 8 + uVar15 * 0x18);
          uVar11 = lVar17 - lVar19;
          if ((ulong)((long)uVar11 >> 4) <= uVar20 + 1) goto LAB_00106ce2;
          uVar22 = uVar13 + 1;
          pvVar18 = (land1->land).
                    super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar17 = *(long *)&pvVar18[uVar15].
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             ._M_impl;
          uVar11 = uVar20 + 1;
          uVar23 = uVar20;
        } while (uVar22 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar18[uVar15].
                                                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                                 ._M_impl + 8) - lVar17 >> 4));
      }
LAB_00106cd3:
      lVar19 = *(long *)(lVar14 + uVar15 * 0x18);
      lVar17 = *(long *)(lVar14 + 8 + uVar15 * 0x18);
      uVar11 = lVar17 - lVar19;
    }
LAB_00106ce2:
    uVar22 = uVar20 + 1;
    uVar11 = (long)uVar11 >> 4;
    if (uVar22 < uVar11) {
      pvVar18 = (land1->land).
                super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)*(pointer *)
                         ((long)&pvVar18[uVar15].
                                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                 ._M_impl + 8) -
                  *(long *)&pvVar18[uVar15].
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl >> 4) <= uVar13 + 1) {
        lVar14 = uVar20 << 4;
        do {
          local_78.first = *(double *)(lVar19 + lVar14);
          local_78.second = ((double *)(lVar19 + lVar14))[1];
          if (local_98.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_98.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
            _M_realloc_insert<std::pair<double,double>>
                      ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                       &local_98,
                       (iterator)
                       local_98.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_78);
          }
          else {
            (local_98.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->first = local_78.first;
            (local_98.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->second = local_78.second;
            local_98.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_98.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar22 = uVar22 + 1;
          lVar19 = *(long *)(*(long *)local_58 + uVar15 * 0x18);
          lVar17 = *(long *)(*(long *)local_58 + 8 + uVar15 * 0x18);
          uVar11 = lVar17 - lVar19 >> 4;
          if (uVar11 <= uVar22) goto LAB_00106d8e;
          pvVar18 = (land1->land).
                    super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar14 = lVar14 + 0x10;
        } while ((ulong)((long)*(pointer *)
                                ((long)&pvVar18[uVar15].
                                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                        ._M_impl + 8) -
                         *(long *)&pvVar18[uVar15].
                                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                   ._M_impl >> 4) <= uVar13 + 1);
      }
      uVar11 = lVar17 - lVar19 >> 4;
    }
LAB_00106d8e:
    this = local_58;
    if (uVar11 <= uVar22) {
      uVar11 = uVar13 << 4 | 8;
      do {
        uVar13 = uVar13 + 1;
        pvVar18 = (land1->land).
                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar14 = *(long *)&pvVar18[uVar15].
                           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           ._M_impl;
        if ((ulong)((long)*(pointer *)
                           ((long)&pvVar18[uVar15].
                                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                   ._M_impl + 8) - lVar14 >> 4) <= uVar13) break;
        local_78.second = 0.0 - *(double *)(lVar14 + uVar11);
        local_78.first = *(double *)(lVar14 + -8 + uVar11);
        if (local_98.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_98.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
          _M_realloc_insert<std::pair<double,double>>
                    ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                     &local_98,
                     (iterator)
                     local_98.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_78);
        }
        else {
          (local_98.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->first = local_78.first;
          (local_98.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->second = local_78.second;
          local_98.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_98.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar11 = uVar11 + 0x10;
      } while ((ulong)(*(long *)(*(long *)this + 8 + uVar15 * 0x18) -
                       *(long *)(*(long *)this + uVar15 * 0x18) >> 4) <= uVar22);
    }
    pPVar9 = local_60;
    local_78.first = 2147483647.0;
    local_78.second = 0.0;
    if (local_98.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_98.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
      _M_realloc_insert<std::pair<double,double>>
                ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                 &local_98,
                 (iterator)
                 local_98.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_78);
    }
    else {
      (local_98.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->first = 2147483647.0;
      (local_98.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->second = 0.0;
      local_98.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_98.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pvVar18 = (pPVar9->land).
              super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = *(pointer *)
              &pvVar18[uVar15].
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl;
    ppVar6 = *(pointer *)
              ((long)&pvVar18[uVar15].
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl + 8);
    ppVar7 = *(pointer *)
              ((long)&pvVar18[uVar15].
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl + 0x10);
    *(pointer *)
     &pvVar18[uVar15].
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl = local_98.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&pvVar18[uVar15].
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl + 8) =
         local_98.
         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&pvVar18[uVar15].
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl + 0x10) =
         local_98.
         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = ppVar5;
    local_98.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar6;
    local_98.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar7;
    if (ppVar5 != (pointer)0x0) {
      operator_delete(ppVar5,(long)ppVar7 - (long)ppVar5);
    }
    uVar15 = local_50 + 1;
  } while( true );
}

Assistant:

Persistence_landscape operation_on_pair_of_landscapes(const Persistence_landscape& land1,
                                                      const Persistence_landscape& land2) {
  bool operation_on_pair_of_landscapesDBG = false;
  if (operation_on_pair_of_landscapesDBG) {
    std::clog << "operation_on_pair_of_landscapes\n";
    std::cin.ignore();
  }
  Persistence_landscape result;
  std::vector<std::vector<std::pair<double, double> > > land(std::max(land1.land.size(), land2.land.size()));
  result.land = land;
  T oper;

  if (operation_on_pair_of_landscapesDBG) {
    for (size_t i = 0; i != std::min(land1.land.size(), land2.land.size()); ++i) {
      std::clog << "land1.land[" << i << "].size() : " << land1.land[i].size() << std::endl;
      std::clog << "land2.land[" << i << "].size() : " << land2.land[i].size() << std::endl;
    }
    getchar();
  }

  for (size_t i = 0; i != std::min(land1.land.size(), land2.land.size()); ++i) {
    std::vector<std::pair<double, double> > lambda_n;
    size_t p = 0;
    size_t q = 0;
    while ((p + 1 < land1.land[i].size()) && (q + 1 < land2.land[i].size())) {
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "p : " << p << "\n";
        std::clog << "q : " << q << "\n";
        std::clog << "land1.land.size() : " << land1.land.size() << std::endl;
        std::clog << "land2.land.size() : " << land2.land.size() << std::endl;
        std::clog << "land1.land[" << i << "].size() : " << land1.land[i].size() << std::endl;
        std::clog << "land2.land[" << i << "].size() : " << land2.land[i].size() << std::endl;
        std::clog << "land1.land[i][p].first : " << land1.land[i][p].first << "\n";
        std::clog << "land2.land[i][q].first : " << land2.land[i][q].first << "\n";
      }

      if (land1.land[i][p].first < land2.land[i][q].first) {
        if (operation_on_pair_of_landscapesDBG) {
          std::clog << "first \n";
          std::clog << " function_value(land2.land[i][q-1],land2.land[i][q],land1.land[i][p].first) : "
                    << function_value(land2.land[i][q - 1], land2.land[i][q], land1.land[i][p].first) << "\n";
        }
        lambda_n.push_back(
            std::make_pair(land1.land[i][p].first,
                           oper(static_cast<double>(land1.land[i][p].second),
                                function_value(land2.land[i][q - 1], land2.land[i][q], land1.land[i][p].first))));
        ++p;
        continue;
      }
      if (land1.land[i][p].first > land2.land[i][q].first) {
        if (operation_on_pair_of_landscapesDBG) {
          std::clog << "Second \n";
          std::clog << "function_value(" << land1.land[i][p - 1].first << " " << land1.land[i][p - 1].second << " ,"
                    << land1.land[i][p].first << " " << land1.land[i][p].second << ", " << land2.land[i][q].first
                    << " ) : " << function_value(land1.land[i][p - 1], land1.land[i][p - 1], land2.land[i][q].first)
                    << "\n";
          std::clog << "oper( " << function_value(land1.land[i][p], land1.land[i][p - 1], land2.land[i][q].first) << ","
                    << land2.land[i][q].second << " : "
                    << oper(land2.land[i][q].second,
                            function_value(land1.land[i][p], land1.land[i][p - 1], land2.land[i][q].first))
                    << "\n";
        }
        lambda_n.push_back(std::make_pair(
            land2.land[i][q].first, oper(function_value(land1.land[i][p], land1.land[i][p - 1], land2.land[i][q].first),
                                         land2.land[i][q].second)));
        ++q;
        continue;
      }
      if (land1.land[i][p].first == land2.land[i][q].first) {
        if (operation_on_pair_of_landscapesDBG) std::clog << "Third \n";
        lambda_n.push_back(
            std::make_pair(land2.land[i][q].first, oper(land1.land[i][p].second, land2.land[i][q].second)));
        ++p;
        ++q;
      }
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "Next iteration \n";
      }
    }
    while ((p + 1 < land1.land[i].size()) && (q + 1 >= land2.land[i].size())) {
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "New point : " << land1.land[i][p].first
                  << "  oper(land1.land[i][p].second,0) : " << oper(land1.land[i][p].second, 0) << std::endl;
      }
      lambda_n.push_back(std::make_pair(land1.land[i][p].first, oper(land1.land[i][p].second, 0)));
      ++p;
    }
    while ((p + 1 >= land1.land[i].size()) && (q + 1 < land2.land[i].size())) {
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "New point : " << land2.land[i][q].first
                  << " oper(0,land2.land[i][q].second) : " << oper(0, land2.land[i][q].second) << std::endl;
      }
      lambda_n.push_back(std::make_pair(land2.land[i][q].first, oper(0, land2.land[i][q].second)));
      ++q;
    }
    lambda_n.push_back(std::make_pair(std::numeric_limits<int>::max(), 0));
    // CHANGE
    // result.land[i] = lambda_n;
    result.land[i].swap(lambda_n);
  }
  if (land1.land.size() > std::min(land1.land.size(), land2.land.size())) {
    if (operation_on_pair_of_landscapesDBG) {
      std::clog << "land1.land.size() > std::min( land1.land.size() , land2.land.size() )" << std::endl;
    }
    for (size_t i = std::min(land1.land.size(), land2.land.size()); i != std::max(land1.land.size(), land2.land.size());
         ++i) {
      std::vector<std::pair<double, double> > lambda_n(land1.land[i]);
      for (size_t nr = 0; nr != land1.land[i].size(); ++nr) {
        lambda_n[nr] = std::make_pair(land1.land[i][nr].first, oper(land1.land[i][nr].second, 0));
      }
      // CHANGE
      // result.land[i] = lambda_n;
      result.land[i].swap(lambda_n);
    }
  }
  if (land2.land.size() > std::min(land1.land.size(), land2.land.size())) {
    if (operation_on_pair_of_landscapesDBG) {
      std::clog << "( land2.land.size() > std::min( land1.land.size() , land2.land.size() ) ) " << std::endl;
    }
    for (size_t i = std::min(land1.land.size(), land2.land.size()); i != std::max(land1.land.size(), land2.land.size());
         ++i) {
      std::vector<std::pair<double, double> > lambda_n(land2.land[i]);
      for (size_t nr = 0; nr != land2.land[i].size(); ++nr) {
        lambda_n[nr] = std::make_pair(land2.land[i][nr].first, oper(0, land2.land[i][nr].second));
      }
      // CHANGE
      // result.land[i] = lambda_n;
      result.land[i].swap(lambda_n);
    }
  }
  if (operation_on_pair_of_landscapesDBG) {
    std::clog << "operation_on_pair_of_landscapes END\n";
    std::cin.ignore();
  }
  return result;
}